

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObservation.cpp
# Opt level: O0

void __thiscall CEObservation::init_members(CEObservation *this)

{
  CESkyCoord *in_RDI;
  CESkyCoord *this_00;
  CESkyCoord *in_stack_ffffffffffffffd0;
  
  (in_RDI->xcoord_)._vptr_CEAngle = (_func_int **)0x0;
  (in_RDI->xcoord_).angle_ = 0.0;
  (in_RDI->ycoord_)._vptr_CEAngle = (_func_int **)0x0;
  (in_RDI->ycoord_).angle_ = 0.0;
  this_00 = (CESkyCoord *)&stack0xffffffffffffffc8;
  CESkyCoord::CESkyCoord(in_stack_ffffffffffffffd0);
  CESkyCoord::operator=(this_00,in_RDI);
  CESkyCoord::~CESkyCoord(this_00);
  *(undefined8 *)&in_RDI[1].coord_type_ = 0;
  in_RDI[2]._vptr_CESkyCoord = (_func_int **)0x0;
  in_RDI[2].xcoord_._vptr_CEAngle = (_func_int **)0x0;
  return;
}

Assistant:

void CEObservation::init_members(void)
{
    // Copy the pointers (this object does not own them)
    body_     = nullptr;
    date_     = nullptr;
    observer_ = nullptr;

    // Copy the cached values
    cached_date_           = 0.0;
    cached_coords_         = CESkyCoord();

    // Note that these are not filled at the moment
    cached_hour_angle_     = 0.0;
    cached_apparentxcoord_ = 0.0;
    cached_apparentycoord_ = 0.0;
}